

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_rule_cache.cc
# Opt level: O0

QuadRule * __thiscall lf::quad::QuadRuleCache::Get(QuadRuleCache *this,RefEl ref_el,uint degree)

{
  uint uVar1;
  size_type sVar2;
  quadDegree_t qVar3;
  size_type sVar4;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  stringstream local_470 [8];
  stringstream ss_1;
  ostream local_460 [383];
  RefElType local_2e1;
  QuadRule local_2e0;
  reference local_2b0;
  value_type *qr;
  value_type *vector;
  stringstream ss;
  uint degree_local;
  QuadRuleCache *this_local;
  RefEl ref_el_local;
  
  this_local._7_1_ = ref_el.type_;
  uVar1 = lf::base::RefEl::Id((RefEl *)((long)&this_local + 7));
  qr = (value_type *)
       std::array<std::deque<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>,_5UL>::
       operator[](&this->cache_,(ulong)uVar1);
  sVar4 = std::deque<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::size
                    ((deque<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *)qr);
  if (sVar4 < degree + 1) {
    std::deque<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::resize
              ((deque<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *)qr,
               (ulong)(degree + 1));
  }
  local_2b0 = std::deque<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::operator[]
                        ((deque<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *)qr,
                         (ulong)degree);
  sVar2 = QuadRule::NumPoints(local_2b0);
  if (sVar2 == 0) {
    local_2e1 = this_local._7_1_;
    make_QuadRule(&local_2e0,this_local._7_1_,degree);
    QuadRule::operator=(local_2b0,&local_2e0);
    QuadRule::~QuadRule(&local_2e0);
  }
  qVar3 = QuadRule::Degree(local_2b0);
  if (degree <= qVar3) {
    return local_2b0;
  }
  std::__cxx11::stringstream::stringstream(local_470);
  std::operator<<(local_460,"something is horribly wrong.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"qr.Degree() >= degree",&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/quad_rule_cache.cc"
             ,&local_4b9);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_490,&local_4b8,0x18,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"false",&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/quad_rule_cache.cc"
             ,&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"",&local_551);
  lf::base::AssertionFailed(&local_500,&local_528,0x18,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  abort();
}

Assistant:

const QuadRule& QuadRuleCache::Get(base::RefEl ref_el, unsigned degree) const {
  LF_ASSERT_MSG(degree >= 0, "degree must be non-negative.");
  auto& vector = cache_[ref_el.Id()];
  if (vector.size() < degree + 1) {
    vector.resize(degree + 1);
  }
  auto& qr = vector[degree];
  if (qr.NumPoints() == 0) {
    qr = make_QuadRule(ref_el, degree);
  }
  LF_ASSERT_MSG(qr.Degree() >= degree, "something is horribly wrong.");
  return qr;
}